

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

Value * duckdb::Value::Numeric(LogicalType *type,int64_t value)

{
  dtime_t value_00;
  timestamp_t value_01;
  timestamp_sec_t timestamp;
  timestamp_ms_t timestamp_00;
  timestamp_ns_t timestamp_01;
  timestamp_tz_t value_02;
  date_t value_03;
  LogicalTypeId LVar1;
  int days_p;
  unsigned_long value_04;
  undefined8 uVar2;
  int64_t in_RDX;
  LogicalType *in_RSI;
  Value *in_RDI;
  int64_t in_stack_ffffffffffffff18;
  LogicalType *in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff28;
  allocator *paVar3;
  hugeint_t *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  Value *this;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  uhugeint_t in_stack_ffffffffffffff60;
  string local_90 [38];
  uint8_t in_stack_ffffffffffffff96;
  uint8_t in_stack_ffffffffffffff97;
  int64_t in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  timestamp_t in_stack_ffffffffffffffb0;
  dtime_t in_stack_ffffffffffffffb8;
  InvalidTypeException *in_stack_ffffffffffffffc0;
  uhugeint_t local_38 [2];
  int64_t local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  LVar1 = LogicalType::id(in_RSI);
  switch(LVar1) {
  case BOOLEAN:
    BOOLEAN((bool)in_stack_ffffffffffffff5f);
    break;
  case TINYINT:
    TINYINT(in_stack_ffffffffffffff5f);
    break;
  case SMALLINT:
    SMALLINT(CONCAT11(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e));
    break;
  case INTEGER:
    INTEGER(CONCAT13(in_stack_ffffffffffffff5f,
                     CONCAT12(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)));
    break;
  case BIGINT:
    BIGINT(CONCAT17(in_stack_ffffffffffffff5f,
                    CONCAT16(in_stack_ffffffffffffff5e,
                             CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
    break;
  case DATE:
    days_p = NumericCast<int,_long,_void>(0x2bc2a1b);
    date_t::date_t((date_t *)&stack0xffffffffffffffc4,days_p);
    value_03.days._2_1_ = in_stack_ffffffffffffff5e;
    value_03.days._0_2_ = in_stack_ffffffffffffff5c;
    value_03.days._3_1_ = in_stack_ffffffffffffff5f;
    DATE(value_03);
    break;
  case TIME:
    dtime_t::dtime_t((dtime_t *)&stack0xffffffffffffffb8,local_18);
    value_00.micros._4_2_ = in_stack_ffffffffffffff5c;
    value_00.micros._0_4_ = in_stack_ffffffffffffff58;
    value_00.micros._6_1_ = in_stack_ffffffffffffff5e;
    value_00.micros._7_1_ = in_stack_ffffffffffffff5f;
    TIME(value_00);
    break;
  case TIMESTAMP_SEC:
    timestamp_sec_t::timestamp_sec_t
              ((timestamp_sec_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    timestamp.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffff5c;
    timestamp.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffff58;
    timestamp.super_timestamp_t.value._6_1_ = in_stack_ffffffffffffff5e;
    timestamp.super_timestamp_t.value._7_1_ = in_stack_ffffffffffffff5f;
    TIMESTAMPSEC(timestamp);
    break;
  case TIMESTAMP_MS:
    timestamp_ms_t::timestamp_ms_t
              ((timestamp_ms_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    timestamp_00.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffff5c;
    timestamp_00.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffff58;
    timestamp_00.super_timestamp_t.value._6_1_ = in_stack_ffffffffffffff5e;
    timestamp_00.super_timestamp_t.value._7_1_ = in_stack_ffffffffffffff5f;
    TIMESTAMPMS(timestamp_00);
    break;
  case TIMESTAMP:
    timestamp_t::timestamp_t((timestamp_t *)&stack0xffffffffffffffb0,local_18);
    value_01.value._4_2_ = in_stack_ffffffffffffff5c;
    value_01.value._0_4_ = in_stack_ffffffffffffff58;
    value_01.value._6_1_ = in_stack_ffffffffffffff5e;
    value_01.value._7_1_ = in_stack_ffffffffffffff5f;
    TIMESTAMP(value_01);
    break;
  case TIMESTAMP_NS:
    timestamp_ns_t::timestamp_ns_t
              ((timestamp_ns_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    timestamp_01.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffff5c;
    timestamp_01.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffff58;
    timestamp_01.super_timestamp_t.value._6_1_ = in_stack_ffffffffffffff5e;
    timestamp_01.super_timestamp_t.value._7_1_ = in_stack_ffffffffffffff5f;
    TIMESTAMPNS(timestamp_01);
    break;
  case DECIMAL:
    DecimalType::GetWidth(in_stack_ffffffffffffff20);
    DecimalType::GetScale(in_stack_ffffffffffffff20);
    DECIMAL(in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff96);
    break;
  case FLOAT:
    Value(this,in_stack_ffffffffffffff3c);
    break;
  case DOUBLE:
    Value(this,(double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x10);
    paVar3 = (allocator *)&stack0xffffffffffffff6f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"Numeric requires numeric type",paVar3);
    InvalidTypeException::InvalidTypeException
              (in_stack_ffffffffffffffc0,(LogicalType *)in_stack_ffffffffffffffb8.micros,
               (string *)in_stack_ffffffffffffffb0.value);
    __cxa_throw(uVar2,&InvalidTypeException::typeinfo,InvalidTypeException::~InvalidTypeException);
  case UTINYINT:
    UTINYINT(in_stack_ffffffffffffff5f);
    break;
  case USMALLINT:
    USMALLINT(CONCAT11(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e));
    break;
  case UINTEGER:
    UINTEGER(CONCAT13(in_stack_ffffffffffffff5f,
                      CONCAT12(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)));
    break;
  case UBIGINT:
    NumericCast<unsigned_long,_long,_void>(0x2bc28f2);
    UBIGINT(CONCAT17(in_stack_ffffffffffffff5f,
                     CONCAT16(in_stack_ffffffffffffff5e,
                              CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
    break;
  case TIMESTAMP_TZ:
    timestamp_tz_t::timestamp_tz_t
              ((timestamp_tz_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    value_02.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffff5c;
    value_02.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffff58;
    value_02.super_timestamp_t.value._6_1_ = in_stack_ffffffffffffff5e;
    value_02.super_timestamp_t.value._7_1_ = in_stack_ffffffffffffff5f;
    TIMESTAMPTZ(value_02);
    break;
  case UHUGEINT:
    value_04 = NumericCast<unsigned_long,_long,_void>(0x2bc2945);
    uhugeint_t::uhugeint_t(local_38,value_04);
    UHUGEINT(in_stack_ffffffffffffff60);
    break;
  case HUGEINT:
    hugeint_t::hugeint_t(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    HUGEINT((hugeint_t)in_stack_ffffffffffffff60);
    break;
  case POINTER:
    NumericCast<unsigned_long,_long,_void>(0x2bc29fc);
    POINTER(CONCAT17(in_stack_ffffffffffffff5f,
                     CONCAT16(in_stack_ffffffffffffff5e,
                              CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
    break;
  case ENUM:
    NumericCast<unsigned_long,_long,_void>(0x2bc2b4f);
    ENUM(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return in_RDI;
}

Assistant:

Value Value::Numeric(const LogicalType &type, int64_t value) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		D_ASSERT(value == 0 || value == 1);
		return Value::BOOLEAN(value ? true : false);
	case LogicalTypeId::TINYINT:
		D_ASSERT(value >= NumericLimits<int8_t>::Minimum() && value <= NumericLimits<int8_t>::Maximum());
		return Value::TINYINT((int8_t)value);
	case LogicalTypeId::SMALLINT:
		D_ASSERT(value >= NumericLimits<int16_t>::Minimum() && value <= NumericLimits<int16_t>::Maximum());
		return Value::SMALLINT((int16_t)value);
	case LogicalTypeId::INTEGER:
		D_ASSERT(value >= NumericLimits<int32_t>::Minimum() && value <= NumericLimits<int32_t>::Maximum());
		return Value::INTEGER((int32_t)value);
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(value);
	case LogicalTypeId::UTINYINT:
		D_ASSERT(value >= NumericLimits<uint8_t>::Minimum() && value <= NumericLimits<uint8_t>::Maximum());
		return Value::UTINYINT((uint8_t)value);
	case LogicalTypeId::USMALLINT:
		D_ASSERT(value >= NumericLimits<uint16_t>::Minimum() && value <= NumericLimits<uint16_t>::Maximum());
		return Value::USMALLINT((uint16_t)value);
	case LogicalTypeId::UINTEGER:
		D_ASSERT(value >= NumericLimits<uint32_t>::Minimum() && value <= NumericLimits<uint32_t>::Maximum());
		return Value::UINTEGER((uint32_t)value);
	case LogicalTypeId::UBIGINT:
		D_ASSERT(value >= 0);
		return Value::UBIGINT(NumericCast<uint64_t>(value));
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(value);
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericCast<uint64_t>(value));
	case LogicalTypeId::DECIMAL:
		return Value::DECIMAL(value, DecimalType::GetWidth(type), DecimalType::GetScale(type));
	case LogicalTypeId::FLOAT:
		return Value((float)value);
	case LogicalTypeId::DOUBLE:
		return Value((double)value);
	case LogicalTypeId::POINTER:
		return Value::POINTER(NumericCast<uintptr_t>(value));
	case LogicalTypeId::DATE:
		D_ASSERT(value >= NumericLimits<int32_t>::Minimum() && value <= NumericLimits<int32_t>::Maximum());
		return Value::DATE(date_t(NumericCast<int32_t>(value)));
	case LogicalTypeId::TIME:
		return Value::TIME(dtime_t(value));
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(timestamp_t(value));
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(timestamp_sec_t(value));
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(timestamp_ms_t(value));
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(timestamp_ns_t(value));
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(timestamp_tz_t(value));
	case LogicalTypeId::ENUM:
		return Value::ENUM(NumericCast<uint64_t>(value), type);
	default:
		throw InvalidTypeException(type, "Numeric requires numeric type");
	}
}